

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_movcf_ps(DisasContext_conflict6 *ctx,int fs,int fd,int cc,int tf)

{
  TCGContext_conflict6 *s;
  TCGTemp *ts;
  TCGLabel *l;
  TCGLabel *l_00;
  int32_t arg2;
  TCGCond cond;
  TCGv_i32 ret;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)ts - (long)s);
  l = gen_new_label_mips64el(s);
  l_00 = gen_new_label_mips64el(s);
  cond = (tf == 0) + TCG_COND_EQ;
  arg2 = 0x800000;
  if (cc != 0) {
    arg2 = 0x1000000 << ((byte)cc & 0x1f);
  }
  tcg_gen_andi_i32_mips64el(s,ret,s->fpu_fcr31,arg2);
  tcg_gen_brcondi_i32_mips64el(s,cond,ret,0,l);
  gen_load_fpr32(ctx,ret,fs);
  gen_store_fpr32(ctx,ret,fd);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
  tcg_gen_andi_i32_mips64el(s,ret,s->fpu_fcr31,0x2000000 << ((byte)cc & 0x1f));
  tcg_gen_brcondi_i32_mips64el(s,cond,ret,0,l_00);
  gen_load_fpr32h(ctx,ret,fs);
  gen_store_fpr32h(ctx,ret,fd);
  tcg_temp_free_internal_mips64el(s,ts);
  *(byte *)l_00 = *(byte *)l_00 | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l_00);
  return;
}

Assistant:

static inline void gen_movcf_ps(DisasContext *ctx, int fs, int fd,
                                int cc, int tf)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int cond;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);

    if (tf) {
        cond = TCG_COND_EQ;
    } else {
        cond = TCG_COND_NE;
    }

    tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, 1 << get_fp_bit(cc));
    tcg_gen_brcondi_i32(tcg_ctx, cond, t0, 0, l1);
    gen_load_fpr32(ctx, t0, fs);
    gen_store_fpr32(ctx, t0, fd);
    gen_set_label(tcg_ctx, l1);

    tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, 1 << get_fp_bit(cc + 1));
    tcg_gen_brcondi_i32(tcg_ctx, cond, t0, 0, l2);
    gen_load_fpr32h(ctx, t0, fs);
    gen_store_fpr32h(ctx, t0, fd);
    tcg_temp_free_i32(tcg_ctx, t0);
    gen_set_label(tcg_ctx, l2);
}